

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.h
# Opt level: O1

void __thiscall btDbvt::collideTV(btDbvt *this,btDbvtNode *root,btDbvtVolume *vol,ICollide *policy)

{
  btDbvtNode *pbVar1;
  btDbvtNode **ppbVar2;
  long lVar3;
  int iVar4;
  btAlignedObjectArray<const_btDbvtNode_*> local_60;
  btScalar local_40;
  btScalar local_3c;
  btScalar local_38;
  btScalar local_34;
  btScalar local_30;
  btScalar local_2c;
  
  if (root != (btDbvtNode *)0x0) {
    local_30 = (vol->mi).m_floats[0];
    local_38 = (vol->mi).m_floats[1];
    local_40 = (vol->mi).m_floats[2];
    local_2c = (vol->mx).m_floats[0];
    local_34 = (vol->mx).m_floats[1];
    local_3c = (vol->mx).m_floats[2];
    local_60.m_ownsMemory = true;
    local_60.m_data = (btDbvtNode **)0x0;
    local_60.m_size = 0;
    local_60.m_capacity = 0;
    ppbVar2 = (btDbvtNode **)btAlignedAllocInternal(0x200,0x10);
    if (0 < (long)local_60.m_size) {
      lVar3 = 0;
      do {
        ppbVar2[lVar3] = local_60.m_data[lVar3];
        lVar3 = lVar3 + 1;
      } while (local_60.m_size != lVar3);
    }
    if ((local_60.m_data != (btDbvtNode **)0x0) && (local_60.m_ownsMemory == true)) {
      btAlignedFreeInternal(local_60.m_data);
    }
    local_60.m_ownsMemory = true;
    local_60.m_capacity = 0x40;
    local_60.m_data = ppbVar2;
    if (local_60.m_size == 0x40) {
      ppbVar2 = (btDbvtNode **)btAlignedAllocInternal(0x400,0x10);
      if (0 < (long)local_60.m_size) {
        lVar3 = 0;
        do {
          ppbVar2[lVar3] = local_60.m_data[lVar3];
          lVar3 = lVar3 + 1;
        } while (local_60.m_size != lVar3);
      }
      if ((local_60.m_data != (btDbvtNode **)0x0) && (local_60.m_ownsMemory == true)) {
        btAlignedFreeInternal(local_60.m_data);
      }
      local_60.m_capacity = 0x80;
      local_60.m_data = ppbVar2;
    }
    local_60.m_ownsMemory = true;
    local_60.m_data[local_60.m_size] = root;
    local_60.m_size = local_60.m_size + 1;
    do {
      pbVar1 = local_60.m_data[(long)local_60.m_size + -1];
      local_60.m_size = local_60.m_size + -1;
      if ((((((pbVar1->volume).mi.m_floats[0] <= local_2c) &&
            (local_30 <= (pbVar1->volume).mx.m_floats[0])) &&
           ((pbVar1->volume).mi.m_floats[1] <= local_34)) &&
          ((local_38 <= (pbVar1->volume).mx.m_floats[1] &&
           ((pbVar1->volume).mi.m_floats[2] <= local_3c)))) &&
         (local_40 <= (pbVar1->volume).mx.m_floats[2])) {
        if ((pbVar1->field_2).childs[1] == (btDbvtNode *)0x0) {
          (*policy->_vptr_ICollide[3])(policy,pbVar1);
        }
        else {
          if (local_60.m_size == local_60.m_capacity) {
            iVar4 = local_60.m_size * 2;
            if (local_60.m_size == 0) {
              iVar4 = 1;
            }
            if (local_60.m_capacity < iVar4) {
              if (iVar4 == 0) {
                ppbVar2 = (btDbvtNode **)0x0;
              }
              else {
                ppbVar2 = (btDbvtNode **)btAlignedAllocInternal((long)iVar4 << 3,0x10);
              }
              if (0 < (long)local_60.m_size) {
                lVar3 = 0;
                do {
                  ppbVar2[lVar3] = local_60.m_data[lVar3];
                  lVar3 = lVar3 + 1;
                } while (local_60.m_size != lVar3);
              }
              if ((local_60.m_data != (btDbvtNode **)0x0) && (local_60.m_ownsMemory == true)) {
                btAlignedFreeInternal(local_60.m_data);
              }
              local_60.m_ownsMemory = true;
              local_60.m_data = ppbVar2;
              local_60.m_capacity = iVar4;
            }
          }
          local_60.m_data[local_60.m_size] = (pbVar1->field_2).childs[0];
          local_60.m_size = local_60.m_size + 1;
          if (local_60.m_size == local_60.m_capacity) {
            iVar4 = local_60.m_size * 2;
            if (local_60.m_size == 0) {
              iVar4 = 1;
            }
            if (local_60.m_capacity < iVar4) {
              if (iVar4 == 0) {
                ppbVar2 = (btDbvtNode **)0x0;
              }
              else {
                ppbVar2 = (btDbvtNode **)btAlignedAllocInternal((long)iVar4 << 3,0x10);
              }
              if (0 < (long)local_60.m_size) {
                lVar3 = 0;
                do {
                  ppbVar2[lVar3] = local_60.m_data[lVar3];
                  lVar3 = lVar3 + 1;
                } while (local_60.m_size != lVar3);
              }
              if ((local_60.m_data != (btDbvtNode **)0x0) && (local_60.m_ownsMemory == true)) {
                btAlignedFreeInternal(local_60.m_data);
              }
              local_60.m_ownsMemory = true;
              local_60.m_data = ppbVar2;
              local_60.m_capacity = iVar4;
            }
          }
          local_60.m_data[local_60.m_size] = (pbVar1->field_2).childs[1];
          local_60.m_size = local_60.m_size + 1;
        }
      }
    } while (0 < local_60.m_size);
    btAlignedObjectArray<const_btDbvtNode_*>::~btAlignedObjectArray(&local_60);
  }
  return;
}

Assistant:

DBVT_PREFIX
inline void		btDbvt::collideTV(	const btDbvtNode* root,
								  const btDbvtVolume& vol,
								  DBVT_IPOLICY) const
{
	DBVT_CHECKTYPE
		if(root)
		{
			ATTRIBUTE_ALIGNED16(btDbvtVolume)		volume(vol);
			btAlignedObjectArray<const btDbvtNode*>	stack;
			stack.resize(0);
			stack.reserve(SIMPLE_STACKSIZE);
			stack.push_back(root);
			do	{
				const btDbvtNode*	n=stack[stack.size()-1];
				stack.pop_back();
				if(Intersect(n->volume,volume))
				{
					if(n->isinternal())
					{
						stack.push_back(n->childs[0]);
						stack.push_back(n->childs[1]);
					}
					else
					{
						policy.Process(n);
					}
				}
			} while(stack.size()>0);
		}
}